

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O2

bool __thiscall xray_re::_vector3<float>::operator<(_vector3<float> *this,_vector3<float> *right)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  
  fVar2 = (this->field_0).field_0.x;
  fVar3 = (right->field_0).field_0.x;
  bVar4 = true;
  if (fVar3 <= fVar2) {
    if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
      return false;
    }
    fVar2 = (this->field_0).field_0.y;
    fVar3 = (right->field_0).field_0.y;
    if (fVar3 <= fVar2) {
      if (fVar2 != fVar3) {
        return false;
      }
      if (NAN(fVar2) || NAN(fVar3)) {
        return false;
      }
      fVar2 = (right->field_0).field_0.z;
      pfVar1 = &(this->field_0).field_0.z;
      bVar4 = *pfVar1 <= fVar2 && fVar2 != *pfVar1;
    }
  }
  return bVar4;
}

Assistant:

inline bool _vector3<T>::operator<(const _vector3<T>& right) const
{
	return x < right.x || (x == right.x && (y < right.y || (y == right.y && z < right.z)));
}